

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::RadioEntityType::Decode(RadioEntityType *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8EntityKind);
    KDataStream::Read(stream,&this->m_ui8Domain);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Country);
    KDataStream::Read(stream,&this->m_ui8Category);
    KDataStream::Read(stream,&this->m_ui8NomenclatureVersion);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Nomenclature);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void RadioEntityType::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RADIO_ENTITY_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EntityKind
           >> m_ui8Domain
           >> m_ui16Country
           >> m_ui8Category
           >> m_ui8NomenclatureVersion
           >> m_ui16Nomenclature;
}